

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void loadMakeData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                 QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
                 QMultiHash<char,_QLatin1String> *other)

{
  QMultiHash<char,_QLatin1String> *other_local;
  QMultiHash<char,_QLatin1String> *literals_local;
  QMultiHash<char,_QLatin1String> *builtin_local;
  QMultiHash<char,_QLatin1String> *keywords_local;
  QMultiHash<char,_QLatin1String> *types_local;
  
  if (!makeDataInitialized) {
    initMakeData();
    makeDataInitialized = true;
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&make_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&make_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&make_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&make_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&make_other);
  return;
}

Assistant:

void loadMakeData(QMultiHash<char, QLatin1String> &types,
                  QMultiHash<char, QLatin1String> &keywords,
                  QMultiHash<char, QLatin1String> &builtin,
                  QMultiHash<char, QLatin1String> &literals,
                  QMultiHash<char, QLatin1String> &other) {
    if (!makeDataInitialized) {
        initMakeData();
        makeDataInitialized = true;
    }
    types = make_types;
    keywords = make_keywords;
    builtin = make_builtin;
    literals = make_literals;
    other = make_other;
}